

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O3

aiScene * __thiscall
Assimp::BaseImporter::ReadFile(BaseImporter *this,Importer *pImp,string *pFile,IOSystem *pIOHandler)

{
  ProgressHandler *pPVar1;
  aiScene *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  FileSystemFilter filter;
  FileSystemFilter local_90;
  
  pPVar1 = Importer::GetProgressHandler(pImp);
  this->m_progress = pPVar1;
  if (pPVar1 == (ProgressHandler *)0x0) {
    this_00 = (aiScene *)0x0;
  }
  else {
    (*this->_vptr_BaseImporter[4])(this,pImp);
    FileSystemFilter::FileSystemFilter(&local_90,pFile,pIOHandler);
    this_00 = (aiScene *)operator_new(0x80);
    aiScene::aiScene(this_00);
    (*this->_vptr_BaseImporter[10])(this,pFile,this_00,&local_90,in_R8,in_R9,this_00);
    (**this->_vptr_BaseImporter)(this,pImp);
    FileSystemFilter::~FileSystemFilter(&local_90);
  }
  return this_00;
}

Assistant:

aiScene* BaseImporter::ReadFile(Importer* pImp, const std::string& pFile, IOSystem* pIOHandler) {


    m_progress = pImp->GetProgressHandler();
    if (nullptr == m_progress) {
        return nullptr;
    }

    ai_assert(m_progress);

    // Gather configuration properties for this run
    SetupProperties( pImp );

    // Construct a file system filter to improve our success ratio at reading external files
    FileSystemFilter filter(pFile,pIOHandler);

    // create a scene object to hold the data
    std::unique_ptr<aiScene> sc(new aiScene());

    // dispatch importing
    try
    {
        InternReadFile( pFile, sc.get(), &filter);

        // Calculate import scale hook - required because pImp not available anywhere else
        // passes scale into ScaleProcess
        UpdateImporterScale(pImp);


    } catch( const std::exception& err )    {
        // extract error description
        m_ErrorText = err.what();
        ASSIMP_LOG_ERROR(m_ErrorText);
        return nullptr;
    }

    // return what we gathered from the import.
    return sc.release();
}